

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots_approx
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          long Npoints)

{
  long lVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *this_01;
  char *__function;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  VectorXd xpts_n11;
  VectorXd ypts;
  VectorXd abc;
  double _x;
  Vector3d r;
  double x;
  Matrix3d A;
  void *local_238;
  long local_230;
  double local_228;
  vector<double,std::allocator<double>> *local_220;
  undefined1 local_218 [16];
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> local_208;
  ChebyshevExpansion *local_1e8;
  double local_1e0;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_1d8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1d0;
  long local_1c8;
  Scalar local_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  Matrix<double,_3,_1,_0,_3,_1> local_190;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_178;
  double *local_78;
  double dStack_70;
  double **local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = this;
  if (Npoints < -1) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = (double)(Npoints + 1);
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = (double)Npoints;
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 0.0;
  if (Npoints != 0) {
    local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
               .m_data.array[6] /
               local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
               .m_data.array[6];
  }
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = (double)(Npoints + (ulong)(Npoints == 0));
  local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  local_178.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0]._0_1_ = 0;
  local_178.m_colsPermutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = 0x54442d18;
  local_178.m_colsPermutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = 0x400921fb;
  local_220 = (vector<double,std::allocator<double>> *)__return_storage_ptr__;
  local_178.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
  local_178.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] =
       (long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
  local_178.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] =
       (long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_238,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)&local_178);
  y_recurrence_xscaled((ChebyshevExpansion *)local_218,&local_1e8->m_c);
  lVar8 = Npoints + -1;
  if (lVar8 != 0) {
    lVar7 = 0;
    local_1c8 = lVar8;
    do {
      lVar6 = 0;
      if (lVar7 != 0) {
        lVar6 = lVar7 + -1;
      }
      if (((long)local_218._8_8_ <= lVar7) || (lVar1 = lVar7 + 1, (long)local_218._8_8_ <= lVar1))
      goto LAB_001094ca;
      if ((long)((ulong)*(double *)(local_218._0_8_ + lVar1 * 8) ^
                (ulong)*(double *)(local_218._0_8_ + lVar7 * 8)) < 0) {
        if (local_230 <= lVar7) {
LAB_001094ca:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        lVar8 = 0;
        if (lVar7 != 0) {
          lVar8 = lVar7 + -1;
        }
        if ((long)local_218._8_8_ <= lVar8) goto LAB_001094ca;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[1] = 0.0;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[2] = 4.94065645841247e-324;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[3] = 4.94065645841247e-324;
        local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = *(double *)(local_218._0_8_ + lVar8 * 8);
        lVar4 = lVar8 + 1;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[0] = (double)&local_190;
        if ((lVar4 < 0) || ((long)local_218._8_8_ <= lVar4)) goto LAB_001094ca;
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_178,
                             (Scalar *)(local_218._0_8_ + lVar4 * 8));
        lVar8 = lVar8 + 2;
        if ((lVar8 < 0) || ((long)local_218._8_8_ <= lVar8)) goto LAB_001094ca;
        Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                  (this_00,(Scalar *)(local_218._0_8_ + lVar8 * 8));
        if (((long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[3] +
             (long)local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[1] != 3) ||
           ((double **)
            local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[2] != (double **)0x1)) {
          __function = 
          "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
          ;
LAB_001094fe:
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CommaInitializer.h"
                        ,0x7c,__function);
        }
        lVar8 = 3;
        pdVar5 = (double *)&local_78;
        dVar9 = 0.0;
        do {
          if (local_230 <= lVar6) goto LAB_001094ca;
          local_1d8 = *(ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> **)
                       ((long)local_238 + lVar6 * 8);
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[2] = (double)&local_78;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[4] = 0.0;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[5] = 4.94065645841247e-324;
          local_208.m_xpr = (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)&local_178;
          local_208.m_row = 0;
          local_208.m_col = 1;
          local_208.m_currentBlockRows = 1;
          *pdVar5 = (double)local_1d8 * (double)local_1d8;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[0] = (double)pdVar5;
          local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[3] = dVar9;
          this_01 = Eigen::
                    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                    ::operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                                 *)(local_218 + 0x10),(Scalar *)&local_1d8);
          local_1c0 = 1.0;
          Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
          ::operator_(this_01,&local_1c0);
          if ((local_208.m_currentBlockRows + local_208.m_row != 1) ||
             ((double *)local_208.m_col != (double *)0x3)) {
            __function = 
            "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 3, 3>, 1, 3>]"
            ;
            goto LAB_001094fe;
          }
          dVar9 = (double)((long)dVar9 + 1);
          lVar6 = lVar6 + 1;
          pdVar5 = pdVar5 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        local_178.m_isInitialized = false;
        local_178.m_usePrescribedThreshold = false;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[0] = (double)local_78;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[1] = dStack_70;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[2] = (double)local_68;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[3] = dStack_60;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[4] = local_58;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[5] = dStack_50;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[6] = local_48;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[7] = dStack_40;
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[8] = local_38;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::computeInPlace
                  (&local_178);
        lVar8 = local_1c8;
        __return_storage_ptr__ = (vector<double,_std::allocator<double>_> *)local_220;
        if (local_178.m_isInitialized == false) {
          __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/SolverBase.h"
                        ,0x96,
                        "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 3, 1>>]"
                       );
        }
        local_1d8 = &local_178;
        local_1d0 = &local_190;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)(local_218 + 0x10),
                   (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)&local_1d8);
        if (((local_208.m_row < 1) || ((double)local_208.m_row == 4.94065645841247e-324)) ||
           (local_208.m_row < 3)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_1e0 = (((MatrixType *)
                     &(local_208.m_xpr)->
                      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                     )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[0];
        local_1b8 = (((MatrixType *)
                     &(local_208.m_xpr)->
                      super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>
                     )->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[1];
        dVar10 = local_1b8 * local_1b8 +
                 local_1e0 * -4.0 *
                 (((MatrixType *)
                  &(local_208.m_xpr)->
                   super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>)
                 ->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array[2];
        dVar9 = SQRT(dVar10);
        uStack_1b0 = 0;
        dVar13 = dVar9;
        if (dVar10 < 0.0) {
          uStack_1a0 = 0;
          local_228 = dVar9;
          local_1a8 = dVar10;
          dVar9 = sqrt(dVar10);
          dVar10 = local_1a8;
          dVar13 = local_228;
        }
        if (dVar10 < 0.0) {
          local_228 = dVar9;
          dVar13 = sqrt(dVar10);
          dVar9 = local_228;
        }
        if ((local_230 <= lVar7) || (local_230 <= lVar1)) goto LAB_001094ca;
        dVar14 = (dVar9 - local_1b8) / (local_1e0 + local_1e0);
        dVar9 = *(double *)((long)local_238 + lVar7 * 8);
        dVar10 = *(double *)((long)local_238 + lVar1 * 8);
        dVar11 = dVar10;
        if (dVar9 <= dVar10) {
          dVar11 = dVar9;
        }
        if (dVar11 <= dVar14) {
          dVar12 = dVar10;
          if (dVar10 <= dVar9) {
            dVar12 = dVar9;
          }
          bVar2 = dVar14 <= dVar12;
        }
        else {
          bVar2 = false;
        }
        dVar13 = (-local_1b8 - dVar13) / (local_1e0 + local_1e0);
        if (dVar11 <= dVar13) {
          if (dVar10 <= dVar9) {
            dVar10 = dVar9;
          }
          bVar3 = dVar13 <= dVar10;
        }
        else {
          bVar3 = false;
        }
        if (((bVar3) || (!bVar2)) && (dVar14 = dVar13, (bool)(bVar2 | bVar3 ^ 1U))) {
          dVar14 = 1e+99;
        }
        local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
        .array[0] = (local_1e8->m_xmax + local_1e8->m_xmin +
                    (local_1e8->m_xmax - local_1e8->m_xmin) * dVar14) * 0.5;
        __position._M_current = *(double **)((long)__return_storage_ptr__ + 8);
        if (__position._M_current == *(double **)((long)__return_storage_ptr__ + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                     (double *)&local_178);
        }
        else {
          *__position._M_current =
               local_178.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
               .m_data.array[0];
          *(double **)((long)__return_storage_ptr__ + 8) = __position._M_current + 1;
        }
        free(local_208.m_xpr);
      }
      lVar7 = lVar1;
    } while (lVar1 != lVar8);
  }
  free((void *)local_218._0_8_);
  free(local_238);
  return (vector<double,_std::allocator<double>_> *)
         (vector<double,std::allocator<double>> *)__return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_approx(long Npoints)
    {
        std::vector<double> roots;
        // Vector of values in the range [-1,1] as roots of a high-order Chebyshev
        Eigen::VectorXd xpts_n11 = (Eigen::VectorXd::LinSpaced(Npoints + 1, 0, Npoints)*EIGEN_PI / Npoints).array().cos();
        // Scale values into real-world values
        Eigen::VectorXd ypts = y_recurrence_xscaled(xpts_n11);
        // Eigen::MatrixXd buf(Npoints+1, 2); buf.col(0) = xpts; buf.col(1) = ypts; std::cout << buf << std::endl;
        for (size_t i = 0; i < Npoints - 1; ++i) {
            // The change of sign guarantees at least one root between indices i and i+1
            double y1 = ypts(i), y2 = ypts(i + 1);
            bool signchange = (std::signbit(y1) != std::signbit(y2));
            if (signchange) {
                double xscaled = xpts_n11(i);

                // Fit a quadratic given three points; i and i+1 bracket the root, so need one more constraint
                // i0 is the leftmost of the three indices that will be used; when i == 0, use
                // indices i,i+1,i+2, otherwise i-1,i,i+1
                size_t i0 = (i >= 1) ? i - 1 : i;
                Eigen::Vector3d r;
                r << ypts(i0), ypts(i0 + 1), ypts(i0 + 2);
                Eigen::Matrix3d A;
                for (std::size_t irow = 0; irow < 3; ++irow) {
                    double _x = xpts_n11(i0 + irow);
                    A.row(irow) << _x*_x, _x, 1;
                }
                // abc holds the coefficients a,b,c for y = a*x^2 + b*x + c
                Eigen::VectorXd abc = A.colPivHouseholderQr().solve(r);
                double a = abc[0], b = abc[1], c = abc[2];

                // Solve the quadratic and find the root you want
                double x1 = (-b + sqrt(b*b - 4 * a*c)) / (2 * a);
                double x2 = (-b - sqrt(b*b - 4 * a*c)) / (2 * a);
                bool x1_in_range = is_in_closed_range(xpts_n11(i), xpts_n11(i + 1), x1);
                bool x2_in_range = is_in_closed_range(xpts_n11(i), xpts_n11(i + 1), x2);

                // Double check that only one root is within the range
                if (x1_in_range && !x2_in_range) {
                    xscaled = x1;
                }
                else if (x2_in_range && !x1_in_range) {
                    xscaled = x2;
                }
                else {
                    xscaled = 1e99;
                }

                // Rescale back into real-world values
                double x = ((m_xmax - m_xmin)*xscaled + (m_xmax + m_xmin)) / 2.0;
                roots.push_back(x);
            }
            else {
                // TODO: locate other roots based on derivative considerations
            }
        }
        return roots;
    }